

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTransitionMatrix
          (BeagleCPUImpl<float,_1,_0> *this,int matrixIndex,double *inMatrix,double paddedValue)

{
  ulong uVar1;
  int i;
  int iVar2;
  int iVar3;
  float *to;
  
  to = this->gTransitionMatrices[matrixIndex];
  for (iVar2 = 0; iVar2 < this->kCategoryCount; iVar2 = iVar2 + 1) {
    uVar1 = (ulong)(uint)this->kStateCount;
    for (iVar3 = 0; iVar3 < (int)(uint)uVar1; iVar3 = iVar3 + 1) {
      beagleMemCpy<float,double_const>(to,inMatrix,(uint)uVar1);
      uVar1 = (ulong)this->kStateCount;
      inMatrix = inMatrix + uVar1;
      to[uVar1] = (float)paddedValue;
      to = to + this->kTransPaddedStateCount;
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTransitionMatrix(int matrixIndex,
                                       const double* inMatrix,
                                       double paddedValue) {

if (T_PAD != 0) {
    const double* offsetInMatrix = inMatrix;
    REALTYPE* offsetBeagleMatrix = gTransitionMatrices[matrixIndex];
    for(int i = 0; i < kCategoryCount; i++) {
        for(int j = 0; j < kStateCount; j++) {
            beagleMemCpy(offsetBeagleMatrix, offsetInMatrix, kStateCount);
            offsetBeagleMatrix[kStateCount] = paddedValue;
            offsetBeagleMatrix += kTransPaddedStateCount; // Skip padding
            offsetInMatrix += kStateCount;
        }
    }
} else {
    beagleMemCpy(gTransitionMatrices[matrixIndex], inMatrix,
                 kMatrixSize * kCategoryCount);
}
    return BEAGLE_SUCCESS;
}